

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O0

U32 ZSTD_insertAndFindFirstIndexHash3(ZSTD_matchState_t *ms,U32 *nextToUpdate3,BYTE *ip)

{
  U32 h;
  U32 *pUVar1;
  BYTE *pBVar2;
  uint uVar3;
  size_t sVar4;
  size_t sVar5;
  size_t hash3;
  U32 target;
  U32 idx;
  BYTE *base;
  U32 hashLog3;
  U32 *hashTable3;
  BYTE *ip_local;
  U32 *nextToUpdate3_local;
  ZSTD_matchState_t *ms_local;
  
  pUVar1 = ms->hashTable3;
  h = ms->hashLog3;
  pBVar2 = (ms->window).base;
  hash3._4_4_ = *nextToUpdate3;
  uVar3 = (int)ip - (int)pBVar2;
  sVar4 = ZSTD_hash3Ptr(ip,h);
  if (h == 0) {
    __assert_fail("hashLog3 > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                  ,0x46f5,
                  "U32 ZSTD_insertAndFindFirstIndexHash3(ZSTD_matchState_t *, U32 *, const BYTE *const)"
                 );
  }
  for (; hash3._4_4_ < uVar3; hash3._4_4_ = hash3._4_4_ + 1) {
    sVar5 = ZSTD_hash3Ptr(pBVar2 + hash3._4_4_,h);
    pUVar1[sVar5] = hash3._4_4_;
  }
  *nextToUpdate3 = uVar3;
  return pUVar1[sVar4];
}

Assistant:

static U32 ZSTD_insertAndFindFirstIndexHash3 (ZSTD_matchState_t* ms,
                                              U32* nextToUpdate3,
                                              const BYTE* const ip)
{
    U32* const hashTable3 = ms->hashTable3;
    U32 const hashLog3 = ms->hashLog3;
    const BYTE* const base = ms->window.base;
    U32 idx = *nextToUpdate3;
    U32 const target = (U32)(ip - base);
    size_t const hash3 = ZSTD_hash3Ptr(ip, hashLog3);
    assert(hashLog3 > 0);

    while(idx < target) {
        hashTable3[ZSTD_hash3Ptr(base+idx, hashLog3)] = idx;
        idx++;
    }

    *nextToUpdate3 = target;
    return hashTable3[hash3];
}